

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuilderPackedFieldParsingCase
          (MessageBuilderGenerator *this,Printer *printer,FieldDescriptor *field)

{
  int field_number;
  ImmutableFieldGenerator *pIVar1;
  AlphaNum *a;
  string_view local_a8 [2];
  string_view local_88;
  AlphaNum local_78;
  undefined1 local_48 [8];
  string tagString;
  uint32_t tag;
  FieldDescriptor *field_local;
  Printer *printer_local;
  MessageBuilderGenerator *this_local;
  
  field_number = FieldDescriptor::number(field);
  tagString.field_2._12_4_ =
       protobuf::internal::WireFormatLite::MakeTag(field_number,WIRETYPE_LENGTH_DELIMITED);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_78,tagString.field_2._12_4_);
  absl::lts_20250127::StrCat_abi_cxx11_((string *)local_48,(lts_20250127 *)&local_78,a);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,"case $tag$: {\n");
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,local_88,(char (*) [4])0xa8ecf7,(string *)local_48);
  io::Printer::Indent(printer);
  pIVar1 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                     (&this->field_generators_,field);
  (*(pIVar1->super_FieldGenerator)._vptr_FieldGenerator[0x11])(pIVar1,printer);
  io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_a8,"  break;\n} // case $tag$\n");
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,local_a8[0],(char (*) [4])0xa8ecf7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuilderPackedFieldParsingCase(
    io::Printer* printer, const FieldDescriptor* field) {
  // To make packed = true wire compatible, we generate parsing code from a
  // packed version of this field regardless of field->options().packed().
  uint32_t tag = WireFormatLite::MakeTag(
      field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
  std::string tagString = absl::StrCat(static_cast<int32_t>(tag));
  printer->Print("case $tag$: {\n", "tag", tagString);
  printer->Indent();

  field_generators_.get(field).GenerateBuilderParsingCodeFromPacked(printer);

  printer->Outdent();
  printer->Print(
      "  break;\n"
      "} // case $tag$\n",
      "tag", tagString);
}